

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

Ray * __thiscall pbrt::Transform::operator()(Transform *this,Ray *r,Float *tMax)

{
  float *in_RCX;
  long in_RDX;
  Ray *in_RSI;
  Ray *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Vector3<float> VVar5;
  Vector3<float> *in_stack_00000008;
  Transform *in_stack_00000010;
  Float dt;
  Float lengthSquared;
  Vector3f d;
  Point3fi o;
  Vector3f oError;
  Point3fi *in_stack_000003b8;
  Transform *in_stack_000003c0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Point3fi *in_stack_ffffffffffffff00;
  Float time;
  Ray *t;
  Point3f *p;
  Tuple3<pbrt::Vector3,_float> local_90;
  float local_80;
  float local_7c;
  Interval<float> local_78;
  float local_70;
  undefined1 local_68 [60];
  Vector3<float> local_2c;
  float *local_20;
  long local_18;
  undefined1 auVar4 [56];
  
  auVar4 = in_ZMM0._8_56_;
  t = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Vector3<float>::Vector3((Vector3<float> *)0x4c5bee);
  p = (Point3f *)(local_68 + 0xc);
  Point3fi::Point3fi((Point3fi *)in_RSI,p);
  operator()(in_stack_000003c0,in_stack_000003b8);
  VVar5 = operator()(in_stack_00000010,in_stack_00000008);
  local_70 = VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar1._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar1._8_56_ = auVar4;
  local_78 = (Interval<float>)vmovlpd_avx(auVar1._0_16_);
  local_68._0_8_ = local_78;
  local_68._8_4_ = local_70;
  local_7c = LengthSquared<float>((Vector3<float> *)local_68);
  auVar4 = (undefined1  [56])0x0;
  if (0.0 < local_7c) {
    in_stack_ffffffffffffff00 = (Point3fi *)local_68;
    VVar5 = Abs<pbrt::Vector3,float>((Tuple3<pbrt::Vector3,_float> *)t);
    local_90.z = VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar2._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar2._8_56_ = auVar4;
    local_90._0_8_ = vmovlpd_avx(auVar2._0_16_);
    local_80 = Dot<float>((Vector3<float> *)&local_90,&local_2c);
    local_80 = local_80 / local_7c;
    auVar4 = (undefined1  [56])0x0;
    VVar5 = Tuple3<pbrt::Vector3,float>::operator*
                      ((Tuple3<pbrt::Vector3,_float> *)t,(float)((ulong)in_RDI >> 0x20));
    auVar3._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar3._8_56_ = auVar4;
    vmovlpd_avx(auVar3._0_16_);
    Point3fi::operator+=
              (in_stack_ffffffffffffff00,
               (Vector3<float> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (local_20 != (float *)0x0) {
      *local_20 = *local_20 - local_80;
    }
  }
  Point3<float>::Point3<pbrt::Interval<float>>(&t->o,(Point3<pbrt::Interval<float>_> *)in_RDI);
  time = (Float)((ulong)in_RDI >> 0x20);
  MediumHandle::MediumHandle
            ((MediumHandle *)in_stack_ffffffffffffff00,
             (MediumHandle *)CONCAT44(*(undefined4 *)(local_18 + 0x18),in_stack_fffffffffffffef8));
  Ray::Ray(in_RSI,p,(Vector3f *)t,time,(MediumHandle *)in_stack_ffffffffffffff00);
  return t;
}

Assistant:

inline Ray Transform::operator()(const Ray &r, Float *tMax) const {
    Vector3f oError;
    Point3fi o = (*this)(Point3fi(r.o));
    Vector3f d = (*this)(r.d);
    // Offset ray origin to edge of error bounds and compute _tMax_
    if (Float lengthSquared = LengthSquared(d); lengthSquared > 0) {
        Float dt = Dot(Abs(d), oError) / lengthSquared;
        o += d * dt;
        if (tMax)
            *tMax -= dt;
    }

    return Ray(Point3f(o), d, r.time, r.medium);
}